

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::NeuralNetworkRegressor::MergeFrom
          (NeuralNetworkRegressor *this,NeuralNetworkRegressor *from)

{
  void *pvVar1;
  LogMessage *other;
  NetworkUpdateParameters *this_00;
  NetworkUpdateParameters *from_00;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O2/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x11a6e);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
            (&(this->layers_).super_RepeatedPtrFieldBase,&(from->layers_).super_RepeatedPtrFieldBase
            );
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkPreprocessing>::TypeHandler>
            (&(this->preprocessing_).super_RepeatedPtrFieldBase,
             &(from->preprocessing_).super_RepeatedPtrFieldBase);
  if ((from != (NeuralNetworkRegressor *)&_NeuralNetworkRegressor_default_instance_) &&
     (from->updateparams_ != (NetworkUpdateParameters *)0x0)) {
    this_00 = mutable_updateparams(this);
    from_00 = from->updateparams_;
    if (from_00 == (NetworkUpdateParameters *)0x0) {
      from_00 = (NetworkUpdateParameters *)&_NetworkUpdateParameters_default_instance_;
    }
    NetworkUpdateParameters::MergeFrom(this_00,from_00);
  }
  if (from->arrayinputshapemapping_ != 0) {
    this->arrayinputshapemapping_ = from->arrayinputshapemapping_;
  }
  if (from->imageinputshapemapping_ != 0) {
    this->imageinputshapemapping_ = from->imageinputshapemapping_;
  }
  return;
}

Assistant:

void NeuralNetworkRegressor::MergeFrom(const NeuralNetworkRegressor& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.NeuralNetworkRegressor)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  layers_.MergeFrom(from.layers_);
  preprocessing_.MergeFrom(from.preprocessing_);
  if (from.has_updateparams()) {
    mutable_updateparams()->::CoreML::Specification::NetworkUpdateParameters::MergeFrom(from.updateparams());
  }
  if (from.arrayinputshapemapping() != 0) {
    set_arrayinputshapemapping(from.arrayinputshapemapping());
  }
  if (from.imageinputshapemapping() != 0) {
    set_imageinputshapemapping(from.imageinputshapemapping());
  }
}